

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TeleportLib.cpp
# Opt level: O2

int TeleportFeed(int stream,float *samples,int numsamples)

{
  int iVar1;
  SharedMemory *pSVar2;
  SharedMemoryHandle *pSVar3;
  ulong uVar4;
  int iVar5;
  
  pSVar3 = Teleport::GetSharedMemory();
  pSVar2 = pSVar3->data;
  if (numsamples < 1) {
    numsamples = 0;
  }
  for (uVar4 = 0; (uint)numsamples != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = pSVar2->streams[stream].writepos;
    iVar5 = iVar1 + 1;
    if (iVar1 == 0x15887) {
      iVar5 = 0;
    }
    pSVar2->streams[stream].buffer[iVar5] = samples[uVar4];
    pSVar2->streams[stream].writepos = iVar5;
  }
  return pSVar2->streams[stream].writepos;
}

Assistant:

UNITY_AUDIODSP_EXPORT_API int TeleportFeed(int stream, float* samples, int numsamples)
{
    Teleport::Stream& s = Teleport::GetSharedMemory()->streams[stream];
    for (int n = 0; n < numsamples; n++)
        s.Feed(samples[n]);
    return s.writepos;
}